

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_tiles.cpp
# Opt level: O1

void __thiscall CLayerTiles::ExtractTiles(CLayerTiles *this,CTile *pSavedTiles)

{
  long lVar1;
  uint uVar2;
  
  if (0 < this->m_Height * this->m_Width) {
    lVar1 = 0;
    do {
      lVar1 = (long)(int)lVar1;
      uVar2 = 0xffffffff;
      do {
        if ((long)this->m_Height * (long)this->m_Width <= lVar1) break;
        this->m_pTiles[lVar1] = *pSavedTiles;
        this->m_pTiles[lVar1].m_Skip = '\0';
        lVar1 = lVar1 + 1;
        uVar2 = uVar2 + 1;
      } while (uVar2 < pSavedTiles->m_Skip);
      pSavedTiles = pSavedTiles + 1;
    } while ((int)lVar1 < this->m_Height * this->m_Width);
  }
  return;
}

Assistant:

void CLayerTiles::ExtractTiles(CTile *pSavedTiles)
{
	int i = 0;
	while(i < m_Width * m_Height)
	{
		for(unsigned Counter = 0; Counter <= pSavedTiles->m_Skip && i < m_Width * m_Height; Counter++)
		{
			m_pTiles[i] = *pSavedTiles;
			m_pTiles[i++].m_Skip = 0;
		}

		pSavedTiles++;
	}
}